

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void anon_unknown.dwarf_e7629::AddErrorInfoWithLocation
               (ExpressionContext *ctx,SmallArray<ErrorInfo_*,_4U> *errorList,SynBase *source,
               char *messageStart,char *messageEnd)

{
  undefined4 uVar1;
  ErrorInfo *this;
  char *codeStart;
  size_t sVar2;
  ModuleData *pMVar3;
  ErrorInfo **ppEVar4;
  ModuleData *parentModule;
  char *code;
  char *local_30;
  char *messageEnd_local;
  char *messageStart_local;
  SynBase *source_local;
  SmallArray<ErrorInfo_*,_4U> *errorList_local;
  ExpressionContext *ctx_local;
  
  local_30 = messageEnd;
  messageEnd_local = messageStart;
  messageStart_local = (char *)source;
  source_local = (SynBase *)errorList;
  errorList_local = (SmallArray<ErrorInfo_*,_4U> *)ctx;
  this = ExpressionContext::get<ErrorInfo>(ctx);
  ErrorInfo::ErrorInfo
            (this,(Allocator *)errorList_local[0x278].little[0],messageEnd_local,local_30,
             *(Lexeme **)(messageStart_local + 0x10),*(Lexeme **)(messageStart_local + 0x18),
             *(char **)(messageStart_local + 0x20));
  code = (char *)this;
  SmallArray<ErrorInfo_*,_4U>::push_back(errorList,(ErrorInfo **)&code);
  codeStart = FindModuleCodeWithSourceLocation
                        ((ExpressionContext *)errorList_local,*(char **)(messageStart_local + 0x20))
  ;
  if (codeStart != (char *)0x0) {
    AddErrorLocationInfo
              (codeStart,*(char **)(messageStart_local + 0x20),
               *(char **)&errorList_local[0x268].count,*(uint *)errorList_local[0x268].little);
    sVar2 = strlen((char *)errorList_local[0x268].little[1]);
    errorList_local[0x268].little[1] =
         (ErrorInfo *)((long)(errorList_local[0x268].little[1]->related).little + (sVar2 - 0x40));
    if ((codeStart != *(char **)&errorList_local->count) &&
       (pMVar3 = FindModuleWithSourceLocation
                           ((ExpressionContext *)errorList_local,
                            *(char **)(messageStart_local + 0x20)), pMVar3 != (ModuleData *)0x0)) {
      uVar1 = errorList_local[0x268].count;
      NULLC::SafeSprintf((char *)errorList_local[0x268].little[1],
                         (ulong)(uint)(*(int *)errorList_local[0x268].little -
                                      ((int)errorList_local[0x268].little[1] - uVar1)),
                         " [in module \'%.*s\']\n",
                         (ulong)(uint)((int)(pMVar3->name).end - (int)(pMVar3->name).begin),
                         (pMVar3->name).begin);
      sVar2 = strlen((char *)errorList_local[0x268].little[1]);
      errorList_local[0x268].little[1] =
           (ErrorInfo *)((long)(errorList_local[0x268].little[1]->related).little + (sVar2 - 0x40));
      ppEVar4 = SmallArray<ErrorInfo_*,_4U>::back((SmallArray<ErrorInfo_*,_4U> *)source_local);
      (*ppEVar4)->parentModule = pMVar3;
    }
  }
  return;
}

Assistant:

void AddErrorInfoWithLocation(ExpressionContext &ctx, SmallArray<ErrorInfo*, 4> &errorList, SynBase *source, const char *messageStart, const char *messageEnd)
	{
		errorList.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, source->pos.begin));

		if(const char *code = FindModuleCodeWithSourceLocation(ctx, source->pos.begin))
		{
			AddErrorLocationInfo(code, source->pos.begin, ctx.errorBuf, ctx.errorBufSize);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			if(code != ctx.code)
			{
				ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

				if(parentModule)
				{
					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					errorList.back()->parentModule = parentModule;
				}
			}
		}
	}